

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O3

void __thiscall SStringViewArchive_Empty_Test::TestBody(SStringViewArchive_Empty_Test *this)

{
  database *db;
  span<unsigned_char,__1L> sp;
  typed_address<char> first;
  typed_address<char> last;
  _func_int **message;
  char *message_00;
  mock_mutex mutex;
  shared_sstring_view str;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_d9;
  database_reader local_d8;
  undefined1 local_c8 [16];
  pointer pcVar1;
  bool bVar2;
  undefined7 in_stack_ffffffffffffff51;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  pointer local_88;
  shared_sstring_view local_78;
  transaction<std::unique_lock<mock_mutex>_> local_60;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  message_00 = "";
  anon_unknown.dwarf_374d46::SStringViewArchive::make_shared_sstring_view(&local_78,"");
  local_c8._0_8_ = &local_d9;
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_c8);
  db = &(this->super_SStringViewArchive).db_;
  local_c8[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_60,db,(lock_type *)local_c8);
  first.a_.a_._0_4_ = (*local_60.super_transaction_base._vptr_transaction_base[2])(&local_60,0,1);
  first.a_.a_._4_4_ = extraout_var;
  pcVar1 = (pointer)0x0;
  bVar2 = false;
  local_c8._0_8_ = &PTR__writer_base_0026b400;
  local_c8._8_8_ = &local_60;
  pstore::serialize::string_helper::
  write<pstore::serialize::archive::database_writer,pstore::sstring_view<std::shared_ptr<char_const>>>
            ((database_writer *)local_c8,&local_78);
  last.a_.a_._0_4_ = (*local_60.super_transaction_base._vptr_transaction_base[2])(&local_60,0,1);
  last.a_.a_._4_4_ = extraout_var_00;
  local_d8.db_ = (database *)CONCAT62(local_d8.db_._2_6_,0x100);
  anon_unknown.dwarf_374d46::SStringViewArchive::as_vector
            ((vector<char,_std::allocator<char>_> *)local_c8,&this->super_SStringViewArchive,first,
             last);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char,char>>>::
  operator()(local_98,(char *)&local_d8,
             (vector<char,_std::allocator<char>_> *)"as_vector (first, last)");
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_c8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_c8._0_8_,(long)pcVar1 - local_c8._0_8_);
  }
  if (local_98[0] == '\0') {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_90._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = ((_Alloc_hider *)&(_Stack_90._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp"
               ,0x66,message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((mutex_type *)local_c8._0_8_ != (mutex_type *)0x0) {
      (**(code **)(*(undefined **)local_c8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_90._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_90._M_pi);
  }
  sp.storage_.data_._0_1_ = bVar2;
  sp.storage_.super_extent_type<_1L>.size_ = (index_type)pcVar1;
  sp.storage_.data_._1_7_ = in_stack_ffffffffffffff51;
  local_d8.db_ = db;
  local_d8.addr_ = first.a_.a_;
  pstore::serialize::flood<_1l>(sp);
  pstore::serialize::serializer<pstore::sstring_view<std::shared_ptr<char_const>>,void>::
  readsv<pstore::serialize::archive::database_reader&>(&local_d8,(value_type *)local_c8);
  local_98 = (undefined1  [8])local_c8._0_8_;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
  message = (_func_int **)0x2151a9;
  local_88 = pcVar1;
  testing::internal::CmpHelperEQ<pstore::sstring_view<std::shared_ptr<char_const>>,char[1]>
            ((internal *)local_c8,"actual","\"\"",
             (sstring_view<std::shared_ptr<const_char>_> *)local_98,(char (*) [1])0x2151a9);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((transaction<std::unique_lock<mock_mutex>_> *)local_c8._8_8_ !=
        (transaction<std::unique_lock<mock_mutex>_> *)0x0) {
      message = ((transaction_base *)local_c8._8_8_)->_vptr_transaction_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp"
               ,0x6d,(char *)message);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_d8.db_ != (database *)0x0) {
      (*(local_d8.db_)->_vptr_database[1])();
    }
  }
  if ((transaction<std::unique_lock<mock_mutex>_> *)local_c8._8_8_ !=
      (transaction<std::unique_lock<mock_mutex>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_c8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_
                );
  }
  if ((transaction<std::unique_lock<mock_mutex>_> *)_Stack_90._M_pi !=
      (transaction<std::unique_lock<mock_mutex>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  local_60.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340;
  pstore::transaction_base::rollback(&local_60.super_transaction_base);
  if (local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

TEST_F (SStringViewArchive, Empty) {
    auto str = make_shared_sstring_view ("");

    // Append 'str'' to the store (we don't need to have committed the transaction to be able to
    // access its contents).
    mock_mutex mutex;
    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
    auto const first = pstore::typed_address<char> (this->current_pos (transaction));
    pstore::serialize::write (pstore::serialize::archive::make_writer (transaction), str);

    auto const last = pstore::typed_address<char> (this->current_pos (transaction));
    EXPECT_THAT (as_vector (first, last), ::testing::ElementsAre ('\x1', '\x0'));

    // Now try reading it back and compare to the original string.
    {
        using namespace pstore::serialize;
        shared_sstring_view const actual =
            read<shared_sstring_view> (archive::database_reader{db_, first.to_address ()});
        EXPECT_EQ (actual, "");
    }
}